

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorArkode.cpp
# Opt level: O2

int __thiscall pele::physics::reactions::ReactorArkode::init(ReactorArkode *this,EVP_PKEY_CTX *ctx)

{
  int *ptr;
  int *ptr_00;
  ostringstream *poVar1;
  int iVar2;
  ostream *poVar3;
  int iVar4;
  string method_string;
  string controller_string;
  ParmParse pp;
  Print local_1b8;
  
  this->m_reactor_type = (int)ctx;
  ReactorTypes::check_reactor_type((int)ctx);
  std::__cxx11::string::string((string *)&local_1b8,"ode",(allocator *)&method_string);
  amrex::ParmParse::ParmParse(&pp,(string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  amrex::ParmParse::query
            (&pp,"verbose",
             &(this->super_Register<pele::physics::reactions::ReactorArkode>).super_ReactorBase.
              verbose,0);
  amrex::ParmParse::query(&pp,"use_erkstep",&this->use_erkstep,0);
  amrex::ParmParse::query(&pp,"rtol",&this->relTol,0);
  amrex::ParmParse::query(&pp,"atol",&this->absTol,0);
  amrex::ParmParse::query(&pp,"atomic_reductions",&this->atomic_reductions,0);
  ptr = &this->rk_method;
  amrex::ParmParse::query(&pp,"rk_method",ptr,0);
  ptr_00 = &this->rk_controller;
  amrex::ParmParse::query(&pp,"rk_controller",ptr_00,0);
  amrex::ParmParse::query(&pp,"clean_init_massfrac",&this->m_clean_init_massfrac,0);
  std::__cxx11::string::string
            ((string *)&method_string,"ARKODE_ZONNEVELD_5_3_4",(allocator *)&local_1b8);
  std::__cxx11::string::string((string *)&controller_string,"PID",(allocator *)&local_1b8);
  poVar3 = amrex::OutStream();
  amrex::Print::Print(&local_1b8,poVar3);
  std::operator<<((ostream *)&local_1b8.ss,"Initializing ARKODE:\n");
  amrex::Print::~Print(&local_1b8);
  iVar4 = *ptr;
  iVar2 = 3;
  switch(iVar4) {
  case 0x1e:
    iVar2 = 1;
    break;
  case 0x1f:
    iVar2 = 2;
    break;
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
  case 0x30:
  case 0x31:
    break;
  case 0x29:
    iVar2 = 4;
    break;
  case 0x2a:
    iVar2 = 5;
    break;
  case 0x2b:
    iVar2 = 0xd;
    break;
  case 0x32:
    iVar2 = 6;
    break;
  case 0x33:
    iVar2 = 7;
    break;
  case 0x34:
    iVar2 = 8;
    break;
  case 0x35:
    iVar2 = 9;
    break;
  case 0x36:
    iVar2 = 0xe;
    break;
  default:
    if (iVar4 == 0x14) {
      iVar2 = 0;
    }
    else if (iVar4 == 0x3c) {
      iVar2 = 10;
    }
    else if (iVar4 == 0x50) {
      iVar2 = 0xb;
    }
  }
  *ptr = iVar2;
  std::__cxx11::string::assign((char *)&method_string);
  iVar4 = 0;
  if (*ptr_00 - 1U < 3) {
    iVar4 = *ptr_00;
  }
  *ptr_00 = iVar4;
  std::__cxx11::string::assign((char *)&controller_string);
  if (this->use_erkstep == 1) {
    poVar3 = amrex::OutStream();
    amrex::Print::Print(&local_1b8,poVar3);
    std::operator<<((ostream *)&local_1b8.ss,"  Using ERKStep");
    std::endl<char,std::char_traits<char>>((ostream *)&local_1b8.ss);
  }
  else {
    poVar3 = amrex::OutStream();
    amrex::Print::Print(&local_1b8,poVar3);
    std::operator<<((ostream *)&local_1b8.ss,"  Using ARKStep");
    std::endl<char,std::char_traits<char>>((ostream *)&local_1b8.ss);
  }
  amrex::Print::~Print(&local_1b8);
  poVar3 = amrex::OutStream();
  amrex::Print::Print(&local_1b8,poVar3);
  poVar1 = &local_1b8.ss;
  std::operator<<((ostream *)poVar1,"  Using ");
  std::operator<<((ostream *)poVar1,(string *)&method_string);
  std::operator<<((ostream *)poVar1," method");
  std::endl<char,std::char_traits<char>>((ostream *)poVar1);
  amrex::Print::~Print(&local_1b8);
  poVar3 = amrex::OutStream();
  amrex::Print::Print(&local_1b8,poVar3);
  poVar1 = &local_1b8.ss;
  std::operator<<((ostream *)poVar1,"  Using the ");
  std::operator<<((ostream *)poVar1,(string *)&controller_string);
  std::operator<<((ostream *)poVar1," controller");
  std::endl<char,std::char_traits<char>>((ostream *)poVar1);
  amrex::Print::~Print(&local_1b8);
  if (this->atomic_reductions == 0) {
    poVar3 = amrex::OutStream();
    amrex::Print::Print(&local_1b8,poVar3);
    std::operator<<((ostream *)&local_1b8.ss,"  Using LDS reductions\n");
  }
  else {
    poVar3 = amrex::OutStream();
    amrex::Print::Print(&local_1b8,poVar3);
    std::operator<<((ostream *)&local_1b8.ss,"  Using atomic reductions\n");
  }
  amrex::Print::~Print(&local_1b8);
  std::__cxx11::string::~string((string *)&controller_string);
  std::__cxx11::string::~string((string *)&method_string);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&pp);
  return 0;
}

Assistant:

int
ReactorArkode::init(int reactor_type, int /*ncells*/)
{
  BL_PROFILE("Pele::ReactorArkode::init()");
  m_reactor_type = reactor_type;
  ReactorTypes::check_reactor_type(m_reactor_type);
  amrex::ParmParse pp("ode");
  pp.query("verbose", verbose);
  pp.query("use_erkstep", use_erkstep);
  pp.query("rtol", relTol);
  pp.query("atol", absTol);
  pp.query("atomic_reductions", atomic_reductions);
  pp.query("rk_method", rk_method);
  pp.query("rk_controller", rk_controller);
  pp.query("clean_init_massfrac", m_clean_init_massfrac);
  std::string method_string = "ARKODE_ZONNEVELD_5_3_4";
  std::string controller_string = "PID";

  amrex::Print() << "Initializing ARKODE:\n";

  switch (rk_method) {
  case 20:
    rk_method = ARKODE_HEUN_EULER_2_1_2;
    method_string = "ARKODE_HEUN_EULER_2_1_2";
    break;
  case 30:
    rk_method = ARKODE_BOGACKI_SHAMPINE_4_2_3;
    method_string = "ARKODE_BOGACKI_SHAMPINE_4_2_3";
    break;
  case 31:
    rk_method = ARKODE_ARK324L2SA_ERK_4_2_3;
    method_string = "ARKODE_ARK324L2SA_ERK_4_2_3";
    break;
  case 40:
    rk_method = ARKODE_ZONNEVELD_5_3_4;
    method_string = "ARKODE_ZONNEVELD_5_3_4";
    break;
  case 41:
    rk_method = ARKODE_ARK436L2SA_ERK_6_3_4;
    method_string = "ARKODE_ARK436L2SA_ERK_6_3_4";
    break;
  case 42:
    rk_method = ARKODE_SAYFY_ABURUB_6_3_4;
    method_string = "ARKODE_SAYFY_ABURUB_6_3_4";
    break;
  case 43:
    rk_method = ARKODE_ARK437L2SA_ERK_7_3_4;
    method_string = "ARKODE_ARK437L2SA_ERK_7_3_4";
    break;
  case 50:
    rk_method = ARKODE_CASH_KARP_6_4_5;
    method_string = "ARKODE_CASH_KARP_6_4_5";
    break;
  case 51:
    rk_method = ARKODE_FEHLBERG_6_4_5;
    method_string = "ARKODE_FEHLBERG_6_4_5";
    break;
  case 52:
    rk_method = ARKODE_DORMAND_PRINCE_7_4_5;
    method_string = "ARKODE_DORMAND_PRINCE_7_4_5";
    break;
  case 53:
    rk_method = ARKODE_ARK548L2SA_ERK_8_4_5;
    method_string = "ARKODE_ARK548L2SA_ERK_8_4_5";
    break;
  case 54:
    rk_method = ARKODE_ARK548L2SAb_ERK_8_4_5;
    method_string = "ARKODE_ARK548L2SAb_ERK_8_4_5";
    break;
  case 60:
    rk_method = ARKODE_VERNER_8_5_6;
    method_string = "ARKODE_VERNER_8_5_6";
    break;
  case 80:
    rk_method = ARKODE_FEHLBERG_13_7_8;
    method_string = "ARKODE_FEHLBERG_13_7_8";
    break;
  default:
    rk_method = ARKODE_ZONNEVELD_5_3_4;
    method_string = "ARKODE_ZONNEVELD_5_3_4";
    break;
  }

  switch (rk_controller) {
  case 0:
    rk_controller = ARK_ADAPT_PID;
    controller_string = "PID";
    break;
  case 1:
    rk_controller = ARK_ADAPT_PI;
    controller_string = "PI";
    break;
  case 2:
    rk_controller = ARK_ADAPT_I;
    controller_string = "I";
    break;
  case 3:
    rk_controller = ARK_ADAPT_EXP_GUS;
    controller_string = "explicit Gustafsson";
    break;
  default:
    rk_controller = ARK_ADAPT_PID;
    controller_string = "PID";
    break;
  }

  if (use_erkstep == 1) {
    amrex::Print() << "  Using ERKStep" << std::endl;
  } else {
    amrex::Print() << "  Using ARKStep" << std::endl;
  }
  amrex::Print() << "  Using " << method_string << " method" << std::endl;
  amrex::Print() << "  Using the " << controller_string << " controller"
                 << std::endl;

  if (atomic_reductions != 0) {
    amrex::Print() << "  Using atomic reductions\n";
  } else {
    amrex::Print() << "  Using LDS reductions\n";
  }

  return (0);
}